

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tai_unpack.c
# Opt level: O0

void tai_unpack(char *s,tai *t)

{
  uint64 x;
  tai *t_local;
  char *s_local;
  
  t->x = (ulong)(byte)s[7] +
         ((ulong)(byte)s[6] +
         ((ulong)(byte)s[5] +
         ((ulong)(byte)s[4] +
         ((ulong)(byte)s[3] +
         ((ulong)(byte)s[2] + ((ulong)(byte)s[1] + (ulong)(byte)*s * 0x100) * 0x100) * 0x100) *
         0x100) * 0x100) * 0x100) * 0x100;
  return;
}

Assistant:

void tai_unpack(const char *s,struct tai *t)
{
  uint64 x;

  x = (unsigned char) s[0];
  x <<= 8; x += (unsigned char) s[1];
  x <<= 8; x += (unsigned char) s[2];
  x <<= 8; x += (unsigned char) s[3];
  x <<= 8; x += (unsigned char) s[4];
  x <<= 8; x += (unsigned char) s[5];
  x <<= 8; x += (unsigned char) s[6];
  x <<= 8; x += (unsigned char) s[7];
  t->x = x;
}